

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O0

void __thiscall
ymfm::fm_engine_base<ymfm::opn_registers_base<true>_>::assign_operators
          (fm_engine_base<ymfm::opn_registers_base<true>_> *this)

{
  uint32_t uVar1;
  pointer this_00;
  fm_operator<ymfm::opn_registers_base<true>_> *local_58;
  uint local_30;
  uint32_t opnum;
  uint32_t index;
  uint32_t chnum;
  operator_mapping map;
  fm_engine_base<ymfm::opn_registers_base<true>_>_conflict *this_local;
  
  map.chan._16_8_ = this;
  opn_registers_base<true>::operator_map(&this->m_regs,(operator_mapping *)&index);
  for (opnum = 0; opnum < 6; opnum = opnum + 1) {
    for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
      uVar1 = bitfield((&index)[opnum],local_30 << 3,8);
      this_00 = std::
                unique_ptr<ymfm::fm_channel<ymfm::opn_registers_base<true>_>,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<true>_>_>_>
                ::operator->(this->m_channel + opnum);
      if (uVar1 == 0xff) {
        local_58 = (fm_operator<ymfm::opn_registers_base<true>_> *)0x0;
      }
      else {
        local_58 = std::
                   unique_ptr<ymfm::fm_operator<ymfm::opn_registers_base<true>_>,_std::default_delete<ymfm::fm_operator<ymfm::opn_registers_base<true>_>_>_>
                   ::get(this->m_operator + uVar1);
      }
      fm_channel<ymfm::opn_registers_base<true>_>::assign(this_00,local_30,local_58);
    }
  }
  return;
}

Assistant:

void fm_engine_base<RegisterType>::assign_operators()
{
	typename RegisterType::operator_mapping map;
	m_regs.operator_map(map);

	for (uint32_t chnum = 0; chnum < CHANNELS; chnum++)
		for (uint32_t index = 0; index < 4; index++)
		{
			uint32_t opnum = bitfield(map.chan[chnum], 8 * index, 8);
			m_channel[chnum]->assign(index, (opnum == 0xff) ? nullptr : m_operator[opnum].get());
		}
}